

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalDatatypeValidator.cpp
# Opt level: O1

XProtoType * __thiscall
xercesc_4_0::DecimalDatatypeValidator::getProtoType(DecimalDatatypeValidator *this)

{
  return (XProtoType *)classDecimalDatatypeValidator;
}

Assistant:

void DecimalDatatypeValidator::serialize(XSerializeEngine& serEng)
{
    /***
     * Note:
     *
     *     During storing, we need write the specific number
     *     type info before calling base::serialize().
     *
     *     While loading, we do nothing here
     ***/

    if (serEng.isStoring())
    {
        serEng<<(int) (XMLNumber::BigDecimal);
    }

    AbstractNumericValidator::serialize(serEng);

    //don't serialize XMLBigDecimal*
    if (serEng.isStoring())
    {
        serEng<<fTotalDigits;
        serEng<<fFractionDigits;
    }
    else
    {
        serEng>>fTotalDigits;
        serEng>>fFractionDigits;
    }

}